

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O2

void thread_check_stack(void *arg)

{
  int iVar1;
  pthread_t __th;
  size_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b_1;
  int64_t eval_b_2;
  size_t stack_size;
  rlimit lim;
  pthread_attr_t attr;
  
  iVar1 = getrlimit64(RLIMIT_STACK,(rlimit64 *)&lim);
  attr.__align = (long)iVar1;
  stack_size = 0;
  if (attr.__align == 0) {
    if (lim.rlim_cur == 0xffffffffffffffff) {
      lim.rlim_cur = 0x200000;
    }
    __th = pthread_self();
    iVar1 = pthread_getattr_np(__th,(pthread_attr_t *)&attr);
    stack_size = (size_t)iVar1;
    if (stack_size == 0) {
      iVar1 = pthread_attr_getstacksize((pthread_attr_t *)&attr,&stack_size);
      sVar2 = (size_t)iVar1;
      eval_b_2 = 0;
      if (sVar2 == 0) {
        if ((arg == (void *)0x0) ||
           (eval_b_2 = *(rlim_t *)((long)arg + 8), *(rlim_t *)((long)arg + 8) == 0)) {
          eval_b_2 = lim.rlim_cur;
        }
        if ((long)stack_size < eval_b_2) {
          pcVar5 = ">=";
          pcVar6 = "expected";
          pcVar4 = "stack_size";
          uVar3 = 0xef;
          sVar2 = stack_size;
        }
        else {
          iVar1 = pthread_attr_destroy((pthread_attr_t *)&attr);
          eval_b_2 = 0;
          if ((long)iVar1 == 0) {
            return;
          }
          pcVar5 = "==";
          pcVar6 = "0";
          pcVar4 = "pthread_attr_destroy(&attr)";
          uVar3 = 0xf0;
          sVar2 = (long)iVar1;
        }
      }
      else {
        pcVar5 = "==";
        pcVar6 = "0";
        pcVar4 = "pthread_attr_getstacksize(&attr, &stack_size)";
        uVar3 = 0xeb;
      }
    }
    else {
      pcVar6 = "0";
      pcVar4 = "pthread_getattr_np(pthread_self(), &attr)";
      uVar3 = 0xea;
      eval_b_2 = 0;
      pcVar5 = "==";
      sVar2 = stack_size;
    }
  }
  else {
    pcVar6 = "0";
    pcVar4 = "getrlimit(RLIMIT_STACK, &lim)";
    uVar3 = 0xe7;
    eval_b_2 = 0;
    pcVar5 = "==";
    sVar2 = attr.__align;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,sVar2,pcVar5,eval_b_2);
  abort();
}

Assistant:

static void thread_check_stack(void* arg) {
#if defined(__APPLE__)
  size_t expected;
  expected = arg == NULL ? 0 : ((uv_thread_options_t*)arg)->stack_size;
  /* 512 kB is the default stack size of threads other than the main thread
   * on MacOS. */
  if (expected == 0)
    expected = 512 * 1024;
  ASSERT_GE(pthread_get_stacksize_np(pthread_self()), expected);
#elif defined(__linux__) && defined(__GLIBC__)
  size_t expected;
  struct rlimit lim;
  size_t stack_size;
  pthread_attr_t attr;
  ASSERT_OK(getrlimit(RLIMIT_STACK, &lim));
  if (lim.rlim_cur == RLIM_INFINITY)
    lim.rlim_cur = 2 << 20;  /* glibc default. */
  ASSERT_OK(pthread_getattr_np(pthread_self(), &attr));
  ASSERT_OK(pthread_attr_getstacksize(&attr, &stack_size));
  expected = arg == NULL ? 0 : ((uv_thread_options_t*)arg)->stack_size;
  if (expected == 0)
    expected = (size_t)lim.rlim_cur;
  ASSERT_GE(stack_size, expected);
  ASSERT_OK(pthread_attr_destroy(&attr));
#endif
}